

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O0

Gia_Man_t * Cec3_ManSimulateTest(Gia_Man_t *p,Cec_ParFra_t *pPars0)

{
  Cec3_Par_t *pPars;
  Cec3_Par_t Pars;
  Gia_Man_t *pNew;
  Cec_ParFra_t *pPars0_local;
  Gia_Man_t *p_local;
  
  Pars.fVeryVerbose = 0;
  Pars.fVerbose = 0;
  Cec3_SetDefaultParams((Cec3_Par_t *)&pPars);
  Pars.nSimRounds = pPars0->nBTLimit;
  Pars.nConfLimit = pPars0->fUseCones;
  Pars.fUseCones = pPars0->fVerbose;
  Cec3_ManPerformSweeping(p,(Cec3_Par_t *)&pPars,(Gia_Man_t **)&Pars.fVeryVerbose);
  return (Gia_Man_t *)Pars._24_8_;
}

Assistant:

Gia_Man_t * Cec3_ManSimulateTest( Gia_Man_t * p, Cec_ParFra_t * pPars0 )
{
    Gia_Man_t * pNew = NULL;
    //abctime clk = Abc_Clock();
    Cec3_Par_t Pars, * pPars = &Pars;
    Cec3_SetDefaultParams( pPars );
    // set resource limits
//    pPars->nSimWords  = pPars0->nWords;     // simulation words
//    pPars->nSimRounds = pPars0->nRounds;    // simulation rounds
//    pPars->nItersMax  = pPars0->nItersMax;  // max number of iterations
    pPars->nConfLimit = pPars0->nBTLimit;   // conflict limit at a node
    pPars->fUseCones  = pPars0->fUseCones;
    pPars->fVerbose   = pPars0->fVerbose;
//    Gia_ManComputeGiaEquivs( p, 100000, 0 );
//    Gia_ManEquivPrintClasses( p, 1, 0 );
    Cec3_ManPerformSweeping( p, pPars, &pNew );
    //Abc_PrintTime( 1, "SAT sweeping time", Abc_Clock() - clk );
    return pNew;
}